

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::ByteCodeWriter::TryWriteCallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,CallIExtendedOptions options,uint32 spreadArgsOffset,
          CallFlags callFlags)

{
  bool bVar1;
  undefined1 local_26;
  short local_25;
  undefined2 local_23;
  CallIExtendedOptions local_21;
  undefined1 auStack_20 [2];
  OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if ((((DAT_0159efbd == '\0') &&
       (local_25 = (short)returnValueRegister, (int)local_25 == returnValueRegister)) &&
      (local_23 = (undefined2)functionRegister, functionRegister < 0x10000)) &&
     (local_26 = (undefined1)givenArgCount, givenArgCount < 0x100)) {
    _auStack_20 = spreadArgsOffset;
    layout.super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>._2_4_ = callFlags
    ;
    local_21 = options;
    Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,&local_26,0xe);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteCallIExtendedFlags(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, CallIExtendedOptions options, uint32 spreadArgsOffset, CallFlags callFlags)
    {
        OpLayoutT_CallIExtendedFlags<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Return, returnValueRegister) && SizePolicy::Assign(layout.Function, functionRegister)
            && SizePolicy::Assign(layout.ArgCount, givenArgCount) && SizePolicy::Assign(layout.Options, options)
            && SizePolicy::Assign(layout.SpreadAuxOffset, spreadArgsOffset) && SizePolicy::Assign(layout.callFlags, callFlags))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }